

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_texture_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Instruction *i,bool sparse,bool *forward
          ,SmallVector<unsigned_int,_8UL> *inherited_expressions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  uint *puVar3;
  SmallVector<unsigned_int,_8UL> *pSVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  MSLSamplerYCbCrModelConversion MVar8;
  MSLComponentSwizzle MVar9;
  uint32_t uVar10;
  uint32_t *puVar11;
  SPIRType *pSVar12;
  SPIRVariable *pSVar13;
  MSLConstexprSampler *pMVar14;
  long *plVar15;
  undefined8 *puVar16;
  runtime_error *prVar17;
  undefined7 in_register_00000009;
  long *plVar18;
  size_type *psVar19;
  ushort uVar20;
  char (*ts_2) [2];
  long lVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string inner_expr;
  string local_f0;
  long *local_d0;
  ulong local_c8;
  long local_c0;
  long lStack_b8;
  SmallVector<unsigned_int,_8UL> *local_b0;
  string local_a8;
  uint local_84;
  uint32_t local_80;
  undefined4 local_7c;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  SPIRType *local_50;
  SPIRType *local_48;
  ulong local_40;
  char (*local_38) [2];
  
  local_7c = (undefined4)CONCAT71(in_register_00000009,sparse);
  local_b0 = inherited_expressions;
  local_38 = (char (*) [2])forward;
  puVar11 = Compiler::stream((Compiler *)this,i);
  local_40 = (ulong)*puVar11;
  uVar10 = puVar11[2];
  local_48 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + local_40);
  local_84 = (uint)i->op;
  uVar20 = i->op & 0xfffe;
  pSVar12 = Compiler::expression_type((Compiler *)this,uVar10);
  local_50 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr +
                        (pSVar12->super_IVariant).self.id);
  local_80 = uVar10;
  pSVar13 = Compiler::maybe_get_backing_variable((Compiler *)this,uVar10);
  if (pSVar13 == (SPIRVariable *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    bVar7 = true;
    pMVar14 = (MSLConstexprSampler *)0x0;
    bVar5 = false;
LAB_00270dbd:
    local_58 = &__return_storage_ptr__->field_2;
    if (((this->msl_options).swizzle_texture_samples == true && uVar20 != 0x60) &&
       (bVar6 = Compiler::is_sampled_image_type((Compiler *)this,local_50), bVar6 && bVar5 == false)
       ) {
      add_spv_func_and_recompile(this,SPVFuncImplTextureSwizzle);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_00270ec8;
    }
  }
  else {
    uVar10 = (pSVar13->basevariable).id;
    if (uVar10 == 0) {
      uVar10 = (pSVar13->super_IVariant).self.id;
    }
    pMVar14 = find_constexpr_sampler(this,uVar10);
    bVar5 = Compiler::has_extended_decoration
                      ((Compiler *)this,(pSVar13->super_IVariant).self.id,
                       SPIRVCrossDecorationDynamicImageSampler);
    local_58 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (pMVar14 == (MSLConstexprSampler *)0x0) {
      bVar7 = true;
      pMVar14 = (MSLConstexprSampler *)0x0;
      goto LAB_00270dbd;
    }
    if (bVar5 || pMVar14->ycbcr_conversion_enable != true) {
      bVar7 = false;
      goto LAB_00270dbd;
    }
    MVar8 = pMVar14->ycbcr_model;
    switch(MVar8) {
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
      goto switchD_00270e2f_caseD_0;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT709);
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT601);
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT2020);
      break;
    default:
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"Invalid Y\'CbCr model conversion.","");
      ::std::runtime_error::runtime_error(prVar17,(string *)&local_a8);
      *(undefined ***)prVar17 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    MVar8 = pMVar14->ycbcr_model;
switchD_00270e2f_caseD_0:
    if (MVar8 != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY) {
      if (pMVar14->ycbcr_range == MSL_SAMPLER_YCBCR_RANGE_ITU_NARROW) {
        add_spv_func_and_recompile(this,SPVFuncImplExpandITUNarrowRange);
      }
      else {
        if (pMVar14->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Invalid Y\'CbCr range.","");
          ::std::runtime_error::runtime_error(prVar17,(string *)&local_a8);
          *(undefined ***)prVar17 = &PTR__runtime_error_00357118;
          __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        add_spv_func_and_recompile(this,SPVFuncImplExpandITUFullRange);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    bVar7 = false;
LAB_00270ec8:
    bVar5 = false;
  }
  ts_2 = local_38;
  CompilerGLSL::to_texture_op_abi_cxx11_
            (&local_a8,&this->super_CompilerGLSL,i,local_7c._0_1_,(bool *)local_38,local_b0);
  if ((bVar7) || (pMVar14->ycbcr_conversion_enable != true || bVar5 != false)) {
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_a8._M_dataplus._M_p);
    if (((this->msl_options).swizzle_texture_samples == true && uVar20 != 0x60) &&
       (bVar7 = Compiler::is_sampled_image_type((Compiler *)this,local_50), bVar5 == false && bVar7)
       ) {
      to_swizzle_expression_abi_cxx11_(&local_78,this,local_80);
      plVar15 = (long *)::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x2f06f8);
      plVar18 = plVar15 + 2;
      if ((long *)*plVar15 == plVar18) {
        local_c0 = *plVar18;
        lStack_b8 = plVar15[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar18;
        local_d0 = (long *)*plVar15;
      }
      local_c8 = plVar15[1];
      *plVar15 = (long)plVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_d0);
      psVar19 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_f0.field_2._M_allocated_capacity = *psVar19;
        local_f0.field_2._8_8_ = puVar16[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar19;
        local_f0._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_f0._M_string_length = puVar16[1];
      *puVar16 = psVar19;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      this->used_swizzle_buffer = true;
    }
    goto LAB_00271602;
  }
  if ((pMVar14->swizzle[0] == MSL_COMPONENT_SWIZZLE_IDENTITY &&
      pMVar14->swizzle[1] == MSL_COMPONENT_SWIZZLE_IDENTITY) &&
      pMVar14->swizzle[2] == MSL_COMPONENT_SWIZZLE_IDENTITY) {
    MVar9 = pMVar14->swizzle[3];
    if (MVar9 != MSL_COMPONENT_SWIZZLE_IDENTITY) goto LAB_00270ffd;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_a8._M_dataplus._M_p);
  }
  else {
    if (pMVar14->swizzle[2] - MSL_COMPONENT_SWIZZLE_ZERO < 2 ||
        (pMVar14->swizzle[1] - MSL_COMPONENT_SWIZZLE_ZERO < 2 ||
        pMVar14->swizzle[0] - MSL_COMPONENT_SWIZZLE_ZERO < 2)) goto LAB_00271008;
    MVar9 = pMVar14->swizzle[3];
LAB_00270ffd:
    if (MVar9 - MSL_COMPONENT_SWIZZLE_ZERO < 2) {
LAB_00271008:
      uVar10 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      ts_2 = (char (*) [2])0x0;
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,(uint32_t)local_40,uVar10,&local_a8,false,false);
      sVar2 = (local_b0->super_VectorView<unsigned_int>).buffer_size;
      if (sVar2 != 0) {
        puVar3 = (local_b0->super_VectorView<unsigned_int>).ptr;
        lVar21 = 0;
        do {
          Compiler::inherit_expression_dependencies
                    ((Compiler *)this,uVar10,*(uint32_t *)((long)puVar3 + lVar21));
          lVar21 = lVar21 + 4;
        } while (sVar2 << 2 != lVar21);
      }
      pSVar4 = local_b0;
      (local_b0->super_VectorView<unsigned_int>).buffer_size = 0;
      SmallVector<unsigned_int,_8UL>::reserve(local_b0,1);
      sVar2 = (pSVar4->super_VectorView<unsigned_int>).buffer_size;
      (pSVar4->super_VectorView<unsigned_int>).ptr[sVar2] = uVar10;
      (pSVar4->super_VectorView<unsigned_int>).buffer_size = sVar2 + 1;
      if ((local_84 - 0x57 < 7) && ((0x55U >> (local_84 - 0x57 & 0x1f) & 1) != 0)) {
        CompilerGLSL::register_control_dependent_expression(&this->super_CompilerGLSL,uVar10);
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_d0,this,local_48,0);
      plVar15 = (long *)::std::__cxx11::string::append((char *)&local_d0);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      psVar19 = (size_type *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_f0.field_2._M_allocated_capacity = *psVar19;
        local_f0.field_2._8_8_ = plVar15[3];
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar19;
        local_f0._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_f0._M_string_length = plVar15[1];
      *plVar15 = (long)psVar19;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0);
      }
      lVar21 = 0;
      do {
        switch(pMVar14->swizzle[lVar21]) {
        case MSL_COMPONENT_SWIZZLE_IDENTITY:
          CompilerGLSL::to_expression_abi_cxx11_(&local_78,&this->super_CompilerGLSL,uVar10,true);
          puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_78);
          local_d0 = &local_c0;
          plVar15 = puVar16 + 2;
          if ((long *)*puVar16 == plVar15) {
            local_c0 = *plVar15;
            lStack_b8 = puVar16[3];
          }
          else {
            local_c0 = *plVar15;
            local_d0 = (long *)*puVar16;
          }
          local_c8 = puVar16[1];
          *puVar16 = plVar15;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          ts_2 = (char (*) [2])(ulong)(uint)(int)"rgba"[lVar21];
          puVar16 = (undefined8 *)
                    ::std::__cxx11::string::_M_replace_aux((ulong)&local_d0,local_c8,0,'\x01');
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          psVar19 = puVar16 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_f0.field_2._M_allocated_capacity = *psVar19;
            local_f0.field_2._8_8_ = puVar16[3];
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar19;
            local_f0._M_dataplus._M_p = (pointer)*puVar16;
          }
          local_f0._M_string_length = puVar16[1];
          *puVar16 = psVar19;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
          break;
        case MSL_COMPONENT_SWIZZLE_ZERO:
        case MSL_COMPONENT_SWIZZLE_ONE:
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          goto LAB_00271481;
        case MSL_COMPONENT_SWIZZLE_R:
        case MSL_COMPONENT_SWIZZLE_G:
        case MSL_COMPONENT_SWIZZLE_B:
        case MSL_COMPONENT_SWIZZLE_A:
          CompilerGLSL::to_expression_abi_cxx11_(&local_78,&this->super_CompilerGLSL,uVar10,true);
          puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_78);
          local_d0 = &local_c0;
          plVar15 = puVar16 + 2;
          if ((long *)*puVar16 == plVar15) {
            local_c0 = *plVar15;
            lStack_b8 = puVar16[3];
          }
          else {
            local_c0 = *plVar15;
            local_d0 = (long *)*puVar16;
          }
          local_c8 = puVar16[1];
          *puVar16 = plVar15;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          ts_2 = (char (*) [2])
                 (ulong)(uint)(int)"spvTextureSwizzle("[(long)(int)pMVar14->swizzle[lVar21] + 0x10];
          puVar16 = (undefined8 *)
                    ::std::__cxx11::string::_M_replace_aux((ulong)&local_d0,local_c8,0,'\x01');
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          psVar19 = puVar16 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_f0.field_2._M_allocated_capacity = *psVar19;
            local_f0.field_2._8_8_ = puVar16[3];
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar19;
            local_f0._M_dataplus._M_p = (pointer)*puVar16;
          }
          local_f0._M_string_length = puVar16[1];
          *puVar16 = psVar19;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
          break;
        default:
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,"Invalid component swizzle.","");
          ::std::runtime_error::runtime_error(prVar17,(string *)&local_f0);
          *(undefined ***)prVar17 = &PTR__runtime_error_00357118;
          __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
LAB_00271481:
        if (lVar21 == 3) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          goto LAB_002715a2;
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        lVar21 = lVar21 + 1;
      } while( true );
    }
    paVar1 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    ::std::__cxx11::string::append((char *)&local_f0);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    lVar21 = 0;
    do {
      if ((3 < pMVar14->swizzle[lVar21] - MSL_COMPONENT_SWIZZLE_R) &&
         (pMVar14->swizzle[lVar21] != MSL_COMPONENT_SWIZZLE_IDENTITY)) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_f0._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"Invalid component swizzle.","");
        ::std::runtime_error::runtime_error(prVar17,(string *)&local_f0);
        *(undefined ***)prVar17 = &PTR__runtime_error_00357118;
        __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      lVar21 = lVar21 + 1;
    } while (lVar21 != 4);
  }
LAB_002715a2:
  if (pMVar14->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY) {
    join<char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
              (&local_f0,(spirv_cross *)0x2f06f8,(char (*) [3])&pMVar14->bpc,(uint *)0x2dfe76,ts_2);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (pMVar14->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
LAB_00271602:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_texture_op(const Instruction &i, bool sparse, bool *forward,
                                  SmallVector<uint32_t> &inherited_expressions)
{
	auto *ops = stream(i);
	uint32_t result_type_id = ops[0];
	uint32_t img = ops[2];
	auto &result_type = get<SPIRType>(result_type_id);
	auto op = static_cast<Op>(i.op);
	bool is_gather = (op == OpImageGather || op == OpImageDrefGather);

	// Bypass pointers because we need the real image struct
	auto &type = expression_type(img);
	auto &imgtype = get<SPIRType>(type.self);

	const MSLConstexprSampler *constexpr_sampler = nullptr;
	bool is_dynamic_img_sampler = false;
	if (auto *var = maybe_get_backing_variable(img))
	{
		constexpr_sampler = find_constexpr_sampler(var->basevariable ? var->basevariable : VariableID(var->self));
		is_dynamic_img_sampler = has_extended_decoration(var->self, SPIRVCrossDecorationDynamicImageSampler);
	}

	string expr;
	if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable && !is_dynamic_img_sampler)
	{
		// If this needs sampler Y'CbCr conversion, we need to do some additional
		// processing.
		switch (constexpr_sampler->ycbcr_model)
		{
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
			// Default
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT709);
			expr += "spvConvertYCbCrBT709(";
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT601);
			expr += "spvConvertYCbCrBT601(";
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT2020);
			expr += "spvConvertYCbCrBT2020(";
			break;
		default:
			SPIRV_CROSS_THROW("Invalid Y'CbCr model conversion.");
		}

		if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY)
		{
			switch (constexpr_sampler->ycbcr_range)
			{
			case MSL_SAMPLER_YCBCR_RANGE_ITU_FULL:
				add_spv_func_and_recompile(SPVFuncImplExpandITUFullRange);
				expr += "spvExpandITUFullRange(";
				break;
			case MSL_SAMPLER_YCBCR_RANGE_ITU_NARROW:
				add_spv_func_and_recompile(SPVFuncImplExpandITUNarrowRange);
				expr += "spvExpandITUNarrowRange(";
				break;
			default:
				SPIRV_CROSS_THROW("Invalid Y'CbCr range.");
			}
		}
	}
	else if (msl_options.swizzle_texture_samples && !is_gather && is_sampled_image_type(imgtype) &&
	         !is_dynamic_img_sampler)
	{
		add_spv_func_and_recompile(SPVFuncImplTextureSwizzle);
		expr += "spvTextureSwizzle(";
	}

	string inner_expr = CompilerGLSL::to_texture_op(i, sparse, forward, inherited_expressions);

	if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable && !is_dynamic_img_sampler)
	{
		if (!constexpr_sampler->swizzle_is_identity())
		{
			static const char swizzle_names[] = "rgba";
			if (!constexpr_sampler->swizzle_has_one_or_zero())
			{
				// If we can, do it inline.
				expr += inner_expr + ".";
				for (uint32_t c = 0; c < 4; c++)
				{
					switch (constexpr_sampler->swizzle[c])
					{
					case MSL_COMPONENT_SWIZZLE_IDENTITY:
						expr += swizzle_names[c];
						break;
					case MSL_COMPONENT_SWIZZLE_R:
					case MSL_COMPONENT_SWIZZLE_G:
					case MSL_COMPONENT_SWIZZLE_B:
					case MSL_COMPONENT_SWIZZLE_A:
						expr += swizzle_names[constexpr_sampler->swizzle[c] - MSL_COMPONENT_SWIZZLE_R];
						break;
					default:
						SPIRV_CROSS_THROW("Invalid component swizzle.");
					}
				}
			}
			else
			{
				// Otherwise, we need to emit a temporary and swizzle that.
				uint32_t temp_id = ir.increase_bound_by(1);
				emit_op(result_type_id, temp_id, inner_expr, false);
				for (auto &inherit : inherited_expressions)
					inherit_expression_dependencies(temp_id, inherit);
				inherited_expressions.clear();
				inherited_expressions.push_back(temp_id);

				switch (op)
				{
				case OpImageSampleDrefImplicitLod:
				case OpImageSampleImplicitLod:
				case OpImageSampleProjImplicitLod:
				case OpImageSampleProjDrefImplicitLod:
					register_control_dependent_expression(temp_id);
					break;

				default:
					break;
				}
				expr += type_to_glsl(result_type) + "(";
				for (uint32_t c = 0; c < 4; c++)
				{
					switch (constexpr_sampler->swizzle[c])
					{
					case MSL_COMPONENT_SWIZZLE_IDENTITY:
						expr += to_expression(temp_id) + "." + swizzle_names[c];
						break;
					case MSL_COMPONENT_SWIZZLE_ZERO:
						expr += "0";
						break;
					case MSL_COMPONENT_SWIZZLE_ONE:
						expr += "1";
						break;
					case MSL_COMPONENT_SWIZZLE_R:
					case MSL_COMPONENT_SWIZZLE_G:
					case MSL_COMPONENT_SWIZZLE_B:
					case MSL_COMPONENT_SWIZZLE_A:
						expr += to_expression(temp_id) + "." +
						        swizzle_names[constexpr_sampler->swizzle[c] - MSL_COMPONENT_SWIZZLE_R];
						break;
					default:
						SPIRV_CROSS_THROW("Invalid component swizzle.");
					}
					if (c < 3)
						expr += ", ";
				}
				expr += ")";
			}
		}
		else
			expr += inner_expr;
		if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY)
		{
			expr += join(", ", constexpr_sampler->bpc, ")");
			if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY)
				expr += ")";
		}
	}
	else
	{
		expr += inner_expr;
		if (msl_options.swizzle_texture_samples && !is_gather && is_sampled_image_type(imgtype) &&
		    !is_dynamic_img_sampler)
		{
			// Add the swizzle constant from the swizzle buffer.
			expr += ", " + to_swizzle_expression(img) + ")";
			used_swizzle_buffer = true;
		}
	}

	return expr;
}